

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_extu_i32_i64_x86_64(TCGContext *tcg_ctx,TCGv_i64 ret,TCGv_i32 arg)

{
  TCGArg a1;
  TCGArg a2;
  TCGv_i32 arg_local;
  TCGv_i64 ret_local;
  TCGContext *tcg_ctx_local;
  
  a1 = tcgv_i64_arg(tcg_ctx,ret);
  a2 = tcgv_i32_arg(tcg_ctx,arg);
  tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_extu_i32_i64,a1,a2);
  return;
}

Assistant:

void tcg_gen_extu_i32_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i32 arg)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_mov_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), arg);
        tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), 0);
#else
        tcg_gen_op2(tcg_ctx, INDEX_op_extu_i32_i64,
                    tcgv_i64_arg(tcg_ctx, ret), tcgv_i32_arg(tcg_ctx, arg));
#endif
}